

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

void anon_unknown.dwarf_8f1b29::TranslateEnvironment
               (TEnvironment *environment,EShMessages *messages,EShSource *source,EShLanguage *stage
               ,SpvVersion *spvVersion)

{
  SpvVersion *spvVersion_local;
  EShLanguage *stage_local;
  EShSource *source_local;
  EShMessages *messages_local;
  TEnvironment *environment_local;
  
  if ((*messages & EShMsgSpvRules) != EShMsgDefault) {
    spvVersion->spv = 0x10000;
  }
  if ((*messages & EShMsgVulkanRules) == EShMsgDefault) {
    if (spvVersion->spv != 0) {
      spvVersion->openGl = 100;
    }
  }
  else {
    spvVersion->vulkan = 0x400000;
    spvVersion->vulkanGlsl = 100;
  }
  if (environment != (TEnvironment *)0x0) {
    if ((environment->input).languageFamily != EShSourceNone) {
      *stage = (environment->input).stage;
      switch((environment->input).dialect) {
      case EShClientNone:
        break;
      case EShClientVulkan:
        spvVersion->vulkanGlsl = (environment->input).dialectVersion;
        spvVersion->vulkanRelaxed = (bool)((environment->input).vulkanRulesRelaxed & 1);
        break;
      case EShClientOpenGL:
        spvVersion->openGl = (environment->input).dialectVersion;
        break;
      case EShClientCount:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                      ,0x2da,
                      "void (anonymous namespace)::TranslateEnvironment(const TEnvironment *, EShMessages &, EShSource &, EShLanguage &, SpvVersion &)"
                     );
      }
      switch((environment->input).languageFamily) {
      case EShSourceNone:
        break;
      case EShSourceGlsl:
        *source = EShSourceGlsl;
        *messages = *messages & ~EShMsgReadHlsl;
        break;
      case EShSourceHlsl:
        *source = EShSourceHlsl;
        *messages = *messages | EShMsgReadHlsl;
        break;
      case EShSourceCount:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                      ,0x2e9,
                      "void (anonymous namespace)::TranslateEnvironment(const TEnvironment *, EShMessages &, EShSource &, EShLanguage &, SpvVersion &)"
                     );
      }
    }
    if ((environment->client).client == EShClientVulkan) {
      spvVersion->vulkan = (environment->client).version;
    }
    if ((environment->target).language == EShTargetSpv) {
      spvVersion->spv = (environment->target).version;
    }
  }
  return;
}

Assistant:

void TranslateEnvironment(const TEnvironment* environment, EShMessages& messages, EShSource& source,
                          EShLanguage& stage, SpvVersion& spvVersion)
{
    // Set up environmental defaults, first ignoring 'environment'.
    if (messages & EShMsgSpvRules)
        spvVersion.spv = EShTargetSpv_1_0;
    if (messages & EShMsgVulkanRules) {
        spvVersion.vulkan = EShTargetVulkan_1_0;
        spvVersion.vulkanGlsl = 100;
    } else if (spvVersion.spv != 0)
        spvVersion.openGl = 100;

    // Now, override, based on any content set in 'environment'.
    // 'environment' must be cleared to ESh*None settings when items
    // are not being set.
    if (environment != nullptr) {
        // input language
        if (environment->input.languageFamily != EShSourceNone) {
            stage = environment->input.stage;
            switch (environment->input.dialect) {
            case EShClientNone:
                break;
            case EShClientVulkan:
                spvVersion.vulkanGlsl = environment->input.dialectVersion;
                spvVersion.vulkanRelaxed = environment->input.vulkanRulesRelaxed;
                break;
            case EShClientOpenGL:
                spvVersion.openGl = environment->input.dialectVersion;
                break;
            case EShClientCount:
                assert(0);
                break;
            }
            switch (environment->input.languageFamily) {
            case EShSourceNone:
                break;
            case EShSourceGlsl:
                source = EShSourceGlsl;
                messages = static_cast<EShMessages>(messages & ~EShMsgReadHlsl);
                break;
            case EShSourceHlsl:
                source = EShSourceHlsl;
                messages = static_cast<EShMessages>(messages | EShMsgReadHlsl);
                break;
            case EShSourceCount:
                assert(0);
                break;
            }
        }

        // client
        switch (environment->client.client) {
        case EShClientVulkan:
            spvVersion.vulkan = environment->client.version;
            break;
        default:
            break;
        }

        // generated code
        switch (environment->target.language) {
        case EshTargetSpv:
            spvVersion.spv = environment->target.version;
            break;
        default:
            break;
        }
    }
}